

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryLastIndexOf(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  TypeId TVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptNativeIntArray *pArr_00;
  JavascriptNativeFloatArray *pArr_01;
  TypedArrayBase *local_158;
  TypedArrayBase *typedArrayObj;
  int64 iStack_b0;
  BOOL gotParam;
  int64 fromIndex;
  Var search;
  RecyclableObject *obj;
  JavascriptArray *pArr;
  int64 length;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x12d1,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_78,pTVar6);
  pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pvVar8);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x12d8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  obj = (RecyclableObject *)0x0;
  search = (Var)0x0;
  JsReentLock::unlock((JsReentLock *)local_78);
  pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
  TryGetArrayAndLength<long>
            (pvVar8,(ScriptContext *)jsReentLock._24_8_,L"Array.prototype.lastIndexOf",
             (JavascriptArray **)&obj,(RecyclableObject **)&search,(long *)&pArr);
  JsReentLock::MutateArrayObject((JsReentLock *)local_78);
  JsReentLock::relock((JsReentLock *)local_78);
  JsReentLock::unlock((JsReentLock *)local_78);
  BVar3 = GetParamForLastIndexOf
                    ((int64)pArr,(Arguments *)&scriptContext,(Var *)&fromIndex,
                     &stack0xffffffffffffff50,(ScriptContext *)jsReentLock._24_8_);
  JsReentLock::MutateArrayObject((JsReentLock *)local_78);
  JsReentLock::relock((JsReentLock *)local_78);
  if (BVar3 == 0) {
    callInfo_local = (CallInfo)TaggedInt::ToVarUnchecked(-1);
  }
  else {
    if (obj != (RecyclableObject *)0x0) {
      bVar2 = IsNonES5Array(search);
      if (!bVar2) {
        bVar2 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)search);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x12ec,"(VarIs<ES5Array>(obj))",
                                      "The array should have been converted to an ES5Array");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        obj = (RecyclableObject *)0x0;
      }
    }
    pvVar8 = search;
    if (obj == (RecyclableObject *)0x0) {
      bVar2 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)search);
      if (bVar2) {
        local_158 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pvVar8)
        ;
      }
      else {
        local_158 = (TypedArrayBase *)0x0;
      }
      if (local_158 == (TypedArrayBase *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_78);
        callInfo_local =
             (CallInfo)
             LastIndexOfHelper<Js::RecyclableObject>
                       ((RecyclableObject *)search,(Var)fromIndex,iStack_b0,
                        (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_78);
        callInfo_local =
             (CallInfo)
             LastIndexOfHelper<Js::TypedArrayBase>
                       (local_158,(Var)fromIndex,iStack_b0,(ScriptContext *)jsReentLock._24_8_);
      }
    }
    else {
      TVar4 = RecyclableObject::GetTypeId(obj);
      if (TVar4 == TypeIds_Array) {
        JsReentLock::unlock((JsReentLock *)local_78);
        callInfo_local =
             (CallInfo)
             LastIndexOfHelper<Js::JavascriptArray>
                       ((JavascriptArray *)obj,(Var)fromIndex,iStack_b0,
                        (ScriptContext *)jsReentLock._24_8_);
      }
      else if (TVar4 == TypeIds_NativeIntArray) {
        JsReentLock::unlock((JsReentLock *)local_78);
        pArr_00 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>
                            ((JavascriptArray *)obj);
        callInfo_local =
             (CallInfo)
             LastIndexOfHelper<Js::JavascriptNativeIntArray>
                       (pArr_00,(Var)fromIndex,iStack_b0,(ScriptContext *)jsReentLock._24_8_);
      }
      else if (TVar4 == TypeIds_ArrayLast) {
        JsReentLock::unlock((JsReentLock *)local_78);
        pArr_01 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>
                            ((JavascriptArray *)obj);
        callInfo_local =
             (CallInfo)
             LastIndexOfHelper<Js::JavascriptNativeFloatArray>
                       (pArr_01,(Var)fromIndex,iStack_b0,(ScriptContext *)jsReentLock._24_8_);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x12fb,"(0)","invalid array typeid");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
        JsReentLock::unlock((JsReentLock *)local_78);
        callInfo_local =
             (CallInfo)
             LastIndexOfHelper<Js::JavascriptArray>
                       ((JavascriptArray *)obj,(Var)fromIndex,iStack_b0,
                        (ScriptContext *)jsReentLock._24_8_);
      }
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_78);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptArray::EntryLastIndexOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_LastIndexOf);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_lastIndexOf);

        Assert(!(callInfo.Flags & CallFlags_New));

        int64 length;
        JavascriptArray * pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.lastIndexOf"), &pArr, &obj, &length));

        Var search;
        int64 fromIndex;
        JS_REENTRANT(jsReentLock,
            BOOL gotParam = GetParamForLastIndexOf(length, args, search, fromIndex, scriptContext));
        if (!gotParam)
        {
            return TaggedInt::ToVarUnchecked(-1);
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of fromIndex argument may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            switch (pArr->GetTypeId())
            {
            case Js::TypeIds_Array:
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(pArr, search, fromIndex, scriptContext));
            case Js::TypeIds_NativeIntArray:
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(UnsafeVarTo<JavascriptNativeIntArray>(pArr), search, fromIndex, scriptContext));
            case Js::TypeIds_NativeFloatArray:
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(UnsafeVarTo<JavascriptNativeFloatArray>(pArr), search, fromIndex, scriptContext));
            default:
                AssertMsg(FALSE, "invalid array typeid");
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(pArr, search, fromIndex, scriptContext));
            }
        }

        // source object is not a JavascriptArray but source could be a TypedArray
        TypedArrayBase * typedArrayObj = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(obj);
        if (typedArrayObj)
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(typedArrayObj, search, fromIndex, scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(obj, search, fromIndex, scriptContext));
        JIT_HELPER_END(Array_LastIndexOf);
    }